

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O0

int lws_protocol_init(lws_context *context)

{
  int iVar1;
  int local_24;
  lws_vhost *plStack_20;
  int any;
  lws_vhost *vh;
  lws_context *context_local;
  
  plStack_20 = context->vhost_list;
  local_24 = 0;
  if ((*(ushort *)&context->field_0x510 >> 7 & 1) == 0) {
    *(ushort *)&context->field_0x510 = *(ushort *)&context->field_0x510 & 0xff7f | 0x80;
    vh = (lws_vhost *)context;
    _lws_log(8,"%s\n","lws_protocol_init");
    for (; plStack_20 != (lws_vhost *)0x0; plStack_20 = plStack_20->vhost_next) {
      if (((((byte)plStack_20->field_0x2b4 >> 1 & 1) == 0) &&
          ((plStack_20->options & 0x2000000) != 0x2000000)) &&
         (iVar1 = lws_protocol_init_vhost(plStack_20,&local_24), iVar1 != 0)) {
        return 1;
      }
    }
    *(ushort *)vh[1].tls.alpn_ctx.data = *(ushort *)vh[1].tls.alpn_ctx.data & 0xff7f;
    if (((*(ushort *)vh[1].tls.alpn_ctx.data >> 6 & 1) == 0) &&
       (iVar1 = lws_finalize_startup((lws_context *)vh), iVar1 != 0)) {
      context_local._4_4_ = 1;
    }
    else {
      *(ushort *)vh[1].tls.alpn_ctx.data = *(ushort *)vh[1].tls.alpn_ctx.data & 0xffbf | 0x40;
      if (local_24 != 0) {
        lws_tls_check_all_cert_lifetimes((lws_context *)vh);
      }
      context_local._4_4_ = 0;
    }
  }
  else {
    context_local._4_4_ = 0;
  }
  return context_local._4_4_;
}

Assistant:

int
lws_protocol_init(struct lws_context *context)
{
	struct lws_vhost *vh = context->vhost_list;
	int any = 0;

	if (context->doing_protocol_init)
		return 0;

	context->doing_protocol_init = 1;

	lwsl_info("%s\n", __func__);

	while (vh) {

		/* only do the protocol init once for a given vhost */
		if (vh->created_vhost_protocols ||
		    (lws_check_opt(vh->options, LWS_SERVER_OPTION_SKIP_PROTOCOL_INIT)))
			goto next;

		if (lws_protocol_init_vhost(vh, &any))
			return 1;
next:
		vh = vh->vhost_next;
	}

	context->doing_protocol_init = 0;

	if (!context->protocol_init_done && lws_finalize_startup(context))
		return 1;

	context->protocol_init_done = 1;

#if defined(LWS_WITH_SERVER)
	if (any)
		lws_tls_check_all_cert_lifetimes(context);
#endif

	return 0;
}